

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O3

void xSAT_SolverRebuildOrderHeap(xSAT_Solver_t *s)

{
  int iVar1;
  xSAT_Heap_t *h;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *p;
  int *piVar4;
  int iVar5;
  uint uVar6;
  Vec_Str_t *pVVar7;
  long lVar8;
  
  pVVar7 = s->vAssigns;
  iVar1 = pVVar7->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  p->nSize = 0;
  p->nCap = iVar5;
  if (iVar5 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar5 << 2);
  }
  p->pArray = piVar4;
  if (0 < iVar1) {
    lVar8 = 0;
    do {
      if (pVVar7->pArray[lVar8] == '\x03') {
        Vec_IntPush(p,(int)lVar8);
        pVVar7 = s->vAssigns;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar7->nSize);
  }
  h = s->hOrder;
  pVVar2 = h->vHeap;
  if (0 < pVVar2->nSize) {
    piVar4 = pVVar2->pArray;
    pVVar3 = h->vIndices;
    lVar8 = 0;
    do {
      iVar1 = piVar4[lVar8];
      if (((long)iVar1 < 0) || (pVVar3->nSize <= iVar1)) goto LAB_009043e7;
      pVVar3->pArray[iVar1] = -1;
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar2->nSize);
  }
  pVVar2->nSize = 0;
  iVar1 = p->nSize;
  piVar4 = p->pArray;
  if ((long)iVar1 < 1) {
LAB_009043c9:
    if (piVar4 == (int *)0x0) goto LAB_009043d6;
  }
  else {
    lVar8 = 0;
    do {
      iVar5 = piVar4[lVar8];
      if (((long)iVar5 < 0) || (h->vIndices->nSize <= iVar5)) {
LAB_009043e7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      h->vIndices->pArray[iVar5] = (int)lVar8;
      Vec_IntPush(h->vHeap,iVar5);
      lVar8 = lVar8 + 1;
    } while (iVar1 != lVar8);
    uVar6 = h->vHeap->nSize;
    if (1 < (int)uVar6) {
      uVar6 = (uVar6 >> 1) + 1;
      do {
        xSAT_HeapPercolateDown(h,uVar6 - 2);
        uVar6 = uVar6 - 1;
      } while (1 < uVar6);
      goto LAB_009043c9;
    }
  }
  free(piVar4);
LAB_009043d6:
  free(p);
  return;
}

Assistant:

void xSAT_SolverRebuildOrderHeap( xSAT_Solver_t * s )
{
    Vec_Int_t * vTemp = Vec_IntAlloc( Vec_StrSize( s->vAssigns ) );
    int Var;

    for ( Var = 0; Var < Vec_StrSize( s->vAssigns ); Var++ )
        if ( Vec_StrEntry( s->vAssigns, Var ) == VarX )
            Vec_IntPush( vTemp, Var );

    xSAT_HeapBuild( s->hOrder, vTemp );
    Vec_IntFree( vTemp );
}